

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O3

Id_t __thiscall Potassco::AspifTextOutput::Data::addCondition(Data *this,LitSpan *cond)

{
  LitVec *this_00;
  iterator iVar1;
  ulong in_RAX;
  size_t sVar2;
  int *piVar3;
  Id_t IVar4;
  undefined8 local_28;
  
  this_00 = &this->conditions;
  piVar3 = (this->conditions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1._M_current =
       (this->conditions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_28 = in_RAX;
  if (piVar3 == iVar1._M_current) {
    local_28 = in_RAX & 0xffffffff;
    if (piVar3 == (this->conditions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (this_00,iVar1,(int *)((long)&local_28 + 4));
    }
    else {
      *iVar1._M_current = 0;
      (this->conditions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  sVar2 = cond->size;
  if (sVar2 == 0) {
    IVar4 = 0;
  }
  else {
    iVar1._M_current =
         (this->conditions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    IVar4 = (Id_t)((ulong)((long)iVar1._M_current -
                          (long)(this->conditions).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2);
    local_28 = CONCAT44(local_28._4_4_,(int)sVar2);
    if (iVar1._M_current ==
        (this->conditions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,(int *)&local_28)
      ;
      piVar3 = (this->conditions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      sVar2 = cond->size;
    }
    else {
      *iVar1._M_current = (int)sVar2;
      piVar3 = iVar1._M_current + 1;
      (this->conditions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar3;
    }
    std::vector<int,std::allocator<int>>::_M_range_insert<int_const*>
              ((vector<int,std::allocator<int>> *)this_00,piVar3,cond->first,cond->first + sVar2);
  }
  return IVar4;
}

Assistant:

Id_t addCondition(const LitSpan& cond) {
		if (conditions.empty()) { conditions.push_back(0); }
		if (empty(cond)) { return 0; }
		Id_t id = static_cast<Id_t>(conditions.size());
		conditions.push_back(static_cast<Lit_t>(size(cond)));
		conditions.insert(conditions.end(), begin(cond), end(cond));
		return id;
	}